

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O2

void __thiscall Octree::build(Octree *this,Mesh *m)

{
  Box *pbox;
  Vector3f *this_00;
  float fVar1;
  pointer pTVar2;
  ulong __n;
  Vector3f *this_01;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  uint ii;
  int vi;
  int index;
  int dim;
  int i;
  allocator_type local_61;
  Octree *local_60;
  Mesh *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> trigs;
  
  this->mesh = m;
  pTVar2 = (m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (m->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pbox = &this->box;
    Vector3f::operator=(&pbox->mn,(Vector3f *)&pTVar2->field_0x30);
    this_00 = &(this->box).mx;
    local_60 = this;
    Vector3f::operator=(this_00,(Vector3f *)
                                &((m->_triangles).
                                  super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                                  super__Vector_impl_data._M_start)->field_0x30);
    uVar4 = 0;
    local_58 = m;
    while( true ) {
      uVar5 = (ulong)uVar4;
      pTVar2 = (local_58->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __n = ((long)(local_58->_triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x78;
      if (__n <= uVar5) break;
      local_50 = uVar5;
      for (index = 0; index != 3; index = index + 1) {
        this_01 = Triangle::getVertex(pTVar2 + uVar5,index);
        for (i = 0; i != 3; i = i + 1) {
          pfVar3 = Vector3f::operator[](&pbox->mn,i);
          fVar1 = *pfVar3;
          pfVar3 = Vector3f::operator[](this_01,i);
          if (*pfVar3 <= fVar1 && fVar1 != *pfVar3) {
            pfVar3 = Vector3f::operator[](this_01,i);
            fVar1 = *pfVar3;
            pfVar3 = Vector3f::operator[](&pbox->mn,i);
            *pfVar3 = fVar1;
          }
          pfVar3 = Vector3f::operator[](this_00,i);
          fVar1 = *pfVar3;
          pfVar3 = Vector3f::operator[](this_01,i);
          if (fVar1 < *pfVar3) {
            pfVar3 = Vector3f::operator[](this_01,i);
            fVar1 = *pfVar3;
            pfVar3 = Vector3f::operator[](this_00,i);
            *pfVar3 = fVar1;
          }
        }
      }
      uVar4 = (int)local_50 + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector(&trigs,__n,&local_61);
    for (uVar4 = 0;
        (ulong)uVar4 <
        (ulong)((long)trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
      trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar4] = uVar4;
    }
    buildNode(local_60,&local_60->root,pbox,&trigs,local_60->mesh,0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&trigs.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
  __assert_fail("!tri.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Octree.cpp"
                ,0x73,"void Octree::build(Mesh *)");
}

Assistant:

void
Octree::build(Mesh *m) {
    mesh = m;

    const auto &tri = mesh->getTriangles();
    assert(!tri.empty());

    // compute bounding box for m
    box.mn = tri[0].getVertex(0);
    box.mx = tri[0].getVertex(0);
    for (unsigned int ii = 0; ii < tri.size(); ii++) {
        const auto &t = tri[ii];
        for (int vi = 0; vi < 3; ++vi) {
            const auto &v = t.getVertex(vi);
            for (int dim = 0; dim < 3; dim++) {
                if (box.mn[dim] > v[dim]) {
                    box.mn[dim] = v[dim];
                }
                if (box.mx[dim] < v[dim]) {
                    box.mx[dim] = v[dim];
                }
            }
        }
    }

    std::vector<int> trigs(tri.size());
    for (unsigned int ii = 0; ii < trigs.size(); ii++) {
        trigs[ii] = ii;
    }
    buildNode(&root, box, trigs, *mesh, 0);
}